

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udata.cpp
# Opt level: O2

UDataMemory *
udata_openChoice_63(char *path,char *type,char *name,UDataMemoryIsAcceptable *isAcceptable,
                   void *context,UErrorCode *pErrorCode)

{
  bool bVar1;
  byte isICUData;
  UBool UVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  CharString *pCVar6;
  UDataMemory *pUVar7;
  char *dataPath;
  UErrorCode UVar8;
  StringPiece *this;
  long lVar9;
  UErrorCode *context_00;
  UErrorCode *in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdd0;
  UErrorCode UVar10;
  StringPiece SStack_200;
  StringPiece SStack_1f0;
  StringPiece SStack_1e0;
  StringPiece SStack_1d0;
  StringPiece SStack_1c0;
  StringPiece SStack_1b0;
  StringPiece SStack_1a0;
  StringPiece SStack_190;
  CharString CStack_180;
  CharString CStack_140;
  CharString CStack_100;
  CharString CStack_c0;
  StringPiece SStack_80;
  StringPiece SStack_70;
  StringPiece SStack_60;
  StringPiece SStack_50;
  StringPiece SStack_40;
  
  if ((pErrorCode == (UErrorCode *)0x0) || (U_ZERO_ERROR < *pErrorCode)) {
    return (UDataMemory *)0x0;
  }
  if (((name == (char *)0x0) || (isAcceptable == (UDataMemoryIsAcceptable *)0x0)) || (*name == '\0')
     ) {
    *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    return (UDataMemory *)0x0;
  }
  UVar10 = U_ZERO_ERROR;
  if (((path == (char *)0x0) || (iVar3 = strcmp(path,"ICUDATA"), iVar3 == 0)) ||
     ((iVar3 = strncmp(path,"icudt63l-",9), iVar3 == 0 ||
      (iVar3 = strncmp(path,"ICUDATA-",8), iVar3 == 0)))) {
    isICUData = 1;
    bVar1 = false;
  }
  else {
    bVar1 = true;
    isICUData = 0;
  }
  icu_63::MaybeStackArray<char,_40>::MaybeStackArray(&CStack_140.buffer);
  CStack_140.len = 0;
  *CStack_140.buffer.ptr = '\0';
  icu_63::MaybeStackArray<char,_40>::MaybeStackArray(&CStack_100.buffer);
  CStack_100.len = 0;
  *CStack_100.buffer.ptr = '\0';
  icu_63::MaybeStackArray<char,_40>::MaybeStackArray(&CStack_180.buffer);
  CStack_180.len = 0;
  *CStack_180.buffer.ptr = '\0';
  icu_63::MaybeStackArray<char,_40>::MaybeStackArray(&CStack_c0.buffer);
  CStack_c0.len = 0;
  *CStack_c0.buffer.ptr = '\0';
  if (path == (char *)0x0) {
    icu_63::StringPiece::StringPiece(&SStack_190,"icudt63l");
    icu_63::CharString::append(&CStack_180,SStack_190.ptr_,SStack_190.length_,pErrorCode);
    path = (char *)0x0;
  }
  else {
    pcVar4 = strrchr(path,0x2f);
    pcVar5 = strchr(path,0x2f);
    UVar2 = uprv_pathIsAbsolute_63(path);
    if (pcVar4 == pcVar5 && UVar2 == '\0') {
      pcVar5 = strchr(path,0x2d);
      if (pcVar5 == (char *)0x0) {
        if (bVar1) {
          this = &SStack_80;
          icu_63::StringPiece::StringPiece(this,path);
        }
        else {
          this = &SStack_70;
          icu_63::StringPiece::StringPiece(this,"icudt63l");
        }
      }
      else {
        icu_63::StringPiece::StringPiece(&SStack_1a0,pcVar5 + 1);
        icu_63::CharString::append(&CStack_c0,SStack_1a0.ptr_,SStack_1a0.length_,pErrorCode);
        if (bVar1) {
          icu_63::CharString::append(&CStack_180,path,(int)pcVar5 - (int)path,pErrorCode);
          if (pcVar4 == (char *)0x0) {
            path = CStack_180.buffer.ptr;
          }
          goto LAB_0010ef29;
        }
        this = &SStack_60;
        icu_63::StringPiece::StringPiece(this,"icudt63l");
      }
    }
    else if (pcVar4 == (char *)0x0) {
      this = &SStack_50;
      icu_63::StringPiece::StringPiece(this,path);
    }
    else {
      this = &SStack_40;
      icu_63::StringPiece::StringPiece(this,pcVar4 + 1);
    }
    icu_63::CharString::append(&CStack_180,this->ptr_,this->length_,pErrorCode);
  }
LAB_0010ef29:
  icu_63::CharString::append(&CStack_140,&CStack_180,pErrorCode);
  icu_63::CharString::append(&CStack_100,&CStack_180,pErrorCode);
  lVar9 = (long)CStack_140.len;
  if (CStack_c0.len != 0) {
    pCVar6 = icu_63::CharString::append(&CStack_140,'/',pErrorCode);
    icu_63::CharString::append(pCVar6,&CStack_c0,pErrorCode);
    pCVar6 = icu_63::CharString::append(&CStack_100,'/',pErrorCode);
    icu_63::CharString::append(pCVar6,&CStack_c0,pErrorCode);
  }
  pCVar6 = icu_63::CharString::append(&CStack_140,'/',pErrorCode);
  icu_63::StringPiece::StringPiece(&SStack_1b0,name);
  icu_63::CharString::append(pCVar6,SStack_1b0.ptr_,SStack_1b0.length_,pErrorCode);
  pCVar6 = icu_63::CharString::append(&CStack_100,'/',pErrorCode);
  icu_63::StringPiece::StringPiece(&SStack_1c0,name);
  icu_63::CharString::append(pCVar6,SStack_1c0.ptr_,SStack_1c0.length_,pErrorCode);
  if ((type != (char *)0x0) && (*type != '\0')) {
    icu_63::StringPiece::StringPiece(&SStack_1d0,".");
    pCVar6 = icu_63::CharString::append(&CStack_140,SStack_1d0.ptr_,SStack_1d0.length_,pErrorCode);
    icu_63::StringPiece::StringPiece(&SStack_1e0,type);
    icu_63::CharString::append(pCVar6,SStack_1e0.ptr_,SStack_1e0.length_,pErrorCode);
    icu_63::StringPiece::StringPiece(&SStack_1f0,".");
    pCVar6 = icu_63::CharString::append(&CStack_100,SStack_1f0.ptr_,SStack_1f0.length_,pErrorCode);
    icu_63::StringPiece::StringPiece(&SStack_200,type);
    icu_63::CharString::append(pCVar6,SStack_200.ptr_,SStack_200.length_,pErrorCode);
  }
  pcVar4 = "icudt63l";
  if (path != (char *)0x0) {
    pcVar4 = path;
  }
  context_00 = (UErrorCode *)0x10f10a;
  pcVar5 = u_getDataDirectory_63();
  if (isICUData == 0) {
LAB_0010f133:
    if (gDataFileAccess == UDATA_PACKAGES_FIRST) {
      pUVar7 = doLoadFromCommonData
                         (isICUData,CStack_140.buffer.ptr,pcVar4,type,name,(char *)isAcceptable,
                          (char *)context,&stack0xfffffffffffffdd4,
                          (UDataMemoryIsAcceptable *)pErrorCode,context_00,in_stack_fffffffffffffdc8
                          ,(UErrorCode *)CONCAT44(UVar10,in_stack_fffffffffffffdd0));
      if (pUVar7 != (UDataMemory *)0x0) goto LAB_0010f371;
      if (U_ZERO_ERROR < *pErrorCode) goto LAB_0010f36e;
    }
    if ((gDataFileAccess & ~UDATA_PACKAGES_FIRST) == UDATA_DEFAULT_ACCESS) {
      if (pcVar5 == (char *)0x0) {
        if (isICUData == 0) goto LAB_0010f32e;
      }
      else if (!(bool)(isICUData & *pcVar5 == '\0')) {
LAB_0010f32e:
        context_00 = pErrorCode;
        pUVar7 = doLoadFromIndividualFiles
                           (CStack_180.buffer.ptr,pcVar5,CStack_100.buffer.ptr + lVar9 + 1,pcVar4,
                            type,name,isAcceptable,context,(UErrorCode *)&stack0xfffffffffffffdd4,
                            pErrorCode);
        if (pUVar7 != (UDataMemory *)0x0) goto LAB_0010f371;
        if (U_ZERO_ERROR < *pErrorCode) goto LAB_0010f36e;
      }
    }
    if (gDataFileAccess < UDATA_PACKAGES_FIRST) {
      pUVar7 = doLoadFromCommonData
                         (isICUData,CStack_140.buffer.ptr,pcVar4,type,name,(char *)isAcceptable,
                          (char *)context,&stack0xfffffffffffffdd4,
                          (UDataMemoryIsAcceptable *)pErrorCode,context_00,in_stack_fffffffffffffdc8
                          ,(UErrorCode *)CONCAT44(UVar10,in_stack_fffffffffffffdd0));
      if (pUVar7 != (UDataMemory *)0x0) goto LAB_0010f371;
      if (U_ZERO_ERROR < *pErrorCode) goto LAB_0010f36e;
    }
    if ((gDataFileAccess == UDATA_NO_FILES) &&
       (pUVar7 = doLoadFromCommonData
                           (isICUData,CStack_140.buffer.ptr,pcVar4,type,name,(char *)isAcceptable,
                            (char *)context,&stack0xfffffffffffffdd4,
                            (UDataMemoryIsAcceptable *)pErrorCode,context_00,
                            in_stack_fffffffffffffdc8,
                            (UErrorCode *)CONCAT44(UVar10,in_stack_fffffffffffffdd0)),
       pUVar7 != (UDataMemory *)0x0)) goto LAB_0010f371;
    if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      UVar8 = U_FILE_ACCESS_ERROR;
      if (U_ZERO_ERROR < UVar10) {
        UVar8 = UVar10;
      }
      *pErrorCode = UVar8;
    }
  }
  else {
    context_00 = (UErrorCode *)0x10f12b;
    iVar3 = strcmp(type,"res");
    if (iVar3 != 0) goto LAB_0010f133;
    iVar3 = strcmp(name,"zoneinfo64");
    if (((iVar3 != 0) && (iVar3 = strcmp(name,"timezoneTypes"), iVar3 != 0)) &&
       (iVar3 = strcmp(name,"windowsZones"), iVar3 != 0)) {
      context_00 = (UErrorCode *)0x10f2c5;
      iVar3 = strcmp(name,"metaZones");
      if (iVar3 != 0) goto LAB_0010f133;
    }
    context_00 = (UErrorCode *)0x10f2d5;
    dataPath = u_getTimeZoneFilesDirectory_63(pErrorCode);
    if (*dataPath == '\0') goto LAB_0010f133;
    context_00 = pErrorCode;
    pUVar7 = doLoadFromIndividualFiles
                       ("",dataPath,CStack_100.buffer.ptr + lVar9 + 1,"",type,name,isAcceptable,
                        context,(UErrorCode *)&stack0xfffffffffffffdd4,pErrorCode);
    if (pUVar7 != (UDataMemory *)0x0) goto LAB_0010f371;
    if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) goto LAB_0010f133;
  }
LAB_0010f36e:
  pUVar7 = (UDataMemory *)0x0;
LAB_0010f371:
  icu_63::MaybeStackArray<char,_40>::~MaybeStackArray(&CStack_c0.buffer);
  icu_63::MaybeStackArray<char,_40>::~MaybeStackArray(&CStack_180.buffer);
  icu_63::MaybeStackArray<char,_40>::~MaybeStackArray(&CStack_100.buffer);
  icu_63::MaybeStackArray<char,_40>::~MaybeStackArray(&CStack_140.buffer);
  return pUVar7;
}

Assistant:

U_CAPI UDataMemory * U_EXPORT2
udata_openChoice(const char *path, const char *type, const char *name,
                 UDataMemoryIsAcceptable *isAcceptable, void *context,
                 UErrorCode *pErrorCode) {
#ifdef UDATA_DEBUG
  fprintf(stderr, "udata_openChoice(): Opening: %s : %s . %s\n", (path?path:"NULL"), name, type);
#endif

    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return NULL;
    } else if(name==NULL || *name==0 || isAcceptable==NULL) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return NULL;
    } else {
        return doOpenChoice(path, type, name, isAcceptable, context, pErrorCode);
    }
}